

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_registers.h
# Opt level: O0

void __thiscall n_e_s::core::PpuVram::increase_coarse_x(PpuVram *this)

{
  uint8_t uVar1;
  uint8_t coarse_x;
  PpuVram *this_local;
  
  uVar1 = coarse_scroll_x(this);
  if (uVar1 == '\x1f') {
    set_coarse_scroll_x(this,'\0');
    (this->super_Register<unsigned_short>).value_ =
         (this->super_Register<unsigned_short>).value_ ^ 0x400;
  }
  else {
    set_coarse_scroll_x(this,uVar1 + '\x01');
  }
  return;
}

Assistant:

constexpr void increase_coarse_x() {
        const auto coarse_x = coarse_scroll_x();
        if (coarse_x == 31u) {
            set_coarse_scroll_x(0u);
            value_ ^= 0x0400u; // switch horizontal nametable
        } else {
            set_coarse_scroll_x(coarse_x + 1u);
        }
    }